

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void xatlas::internal::opennl::nlJacobiPreconditionerDestroy(NLJacobiPreconditioner *M)

{
  NLJacobiPreconditioner *M_local;
  
  Realloc(M->diag_inv,0,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
          ,0x117a);
  M->diag_inv = (double *)0x0;
  return;
}

Assistant:

static void nlJacobiPreconditionerDestroy(NLJacobiPreconditioner* M)
{
	NL_DELETE_ARRAY(M->diag_inv);
}